

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O0

void tcg_expand_vec_op_riscv64
               (TCGContext_conflict11 *tcg_ctx,TCGOpcode opc,TCGType type,uint vece,TCGArg a0,...)

{
  char in_AL;
  TCGTemp *pTVar1;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined8 *local_258;
  TCGArg *local_208;
  TCGArg *local_1e8;
  undefined8 *local_1c0;
  TCGArg *local_168;
  TCGArg *local_150;
  undefined1 local_128 [40];
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  TCGv_vec local_78;
  TCGv_vec v4;
  TCGv_vec v3;
  TCGv_vec v2;
  TCGv_vec v1;
  TCGv_vec v0;
  TCGArg a2;
  va_list va;
  TCGArg a0_local;
  uint vece_local;
  TCGType type_local;
  TCGOpcode opc_local;
  TCGContext_conflict11 *tcg_ctx_local;
  
  if (in_AL != '\0') {
    local_f8 = in_XMM0_Qa;
    local_e8 = in_XMM1_Qa;
    local_d8 = in_XMM2_Qa;
    local_c8 = in_XMM3_Qa;
    local_b8 = in_XMM4_Qa;
    local_a8 = in_XMM5_Qa;
    local_98 = in_XMM6_Qa;
    local_88 = in_XMM7_Qa;
  }
  va[0].overflow_arg_area = local_128;
  va[0]._0_8_ = &stack0x00000008;
  a2._4_4_ = 0x30;
  a2._0_4_ = 0x28;
  local_100 = in_R9;
  pTVar1 = arg_temp(a0);
  v1 = temp_tcgv_vec(tcg_ctx,pTVar1);
  if ((uint)a2 < 0x29) {
    local_150 = (TCGArg *)((long)(int)(uint)a2 + (long)va[0].overflow_arg_area);
    a2._0_4_ = (uint)a2 + 8;
  }
  else {
    local_150 = (TCGArg *)va[0]._0_8_;
    va[0]._0_8_ = va[0]._0_8_ + 8;
  }
  pTVar1 = arg_temp(*local_150);
  v2 = temp_tcgv_vec(tcg_ctx,pTVar1);
  if ((uint)a2 < 0x29) {
    local_168 = (TCGArg *)((long)(int)(uint)a2 + (long)va[0].overflow_arg_area);
    a2._0_4_ = (uint)a2 + 8;
  }
  else {
    local_168 = (TCGArg *)va[0]._0_8_;
    va[0]._0_8_ = va[0]._0_8_ + 8;
  }
  v0 = (TCGv_vec)*local_168;
  switch(opc) {
  case INDEX_op_mul_vec:
    pTVar1 = arg_temp((TCGArg)v0);
    v3 = temp_tcgv_vec(tcg_ctx,pTVar1);
    expand_vec_mul(tcg_ctx,type,vece,v1,v2,v3);
    break;
  default:
    break;
  case INDEX_op_shli_vec:
  case INDEX_op_shri_vec:
    expand_vec_shi(tcg_ctx,type,vece,opc == INDEX_op_shri_vec,v1,v2,(TCGArg)v0);
    break;
  case INDEX_op_sari_vec:
    expand_vec_sari(tcg_ctx,type,vece,v1,v2,(TCGArg)v0);
    break;
  case INDEX_op_cmp_vec:
    pTVar1 = arg_temp((TCGArg)v0);
    v3 = temp_tcgv_vec(tcg_ctx,pTVar1);
    if ((uint)a2 < 0x29) {
      local_1c0 = (undefined8 *)((long)(int)(uint)a2 + (long)va[0].overflow_arg_area);
      a2._0_4_ = (uint)a2 + 8;
    }
    else {
      local_1c0 = (undefined8 *)va[0]._0_8_;
      va[0]._0_8_ = va[0]._0_8_ + 8;
    }
    expand_vec_cmp(tcg_ctx,type,vece,v1,v2,v3,(TCGCond)*local_1c0);
    break;
  case INDEX_op_cmpsel_vec:
    pTVar1 = arg_temp((TCGArg)v0);
    v3 = temp_tcgv_vec(tcg_ctx,pTVar1);
    if ((uint)a2 < 0x29) {
      local_1e8 = (TCGArg *)((long)(int)(uint)a2 + (long)va[0].overflow_arg_area);
      a2._0_4_ = (uint)a2 + 8;
    }
    else {
      local_1e8 = (TCGArg *)va[0]._0_8_;
      va[0]._0_8_ = va[0]._0_8_ + 8;
    }
    pTVar1 = arg_temp(*local_1e8);
    v4 = temp_tcgv_vec(tcg_ctx,pTVar1);
    if ((uint)a2 < 0x29) {
      local_208 = (TCGArg *)((long)(int)(uint)a2 + (long)va[0].overflow_arg_area);
      a2._0_4_ = (uint)a2 + 8;
    }
    else {
      local_208 = (TCGArg *)va[0]._0_8_;
      va[0]._0_8_ = va[0]._0_8_ + 8;
    }
    pTVar1 = arg_temp(*local_208);
    local_78 = temp_tcgv_vec(tcg_ctx,pTVar1);
    if ((uint)a2 < 0x29) {
      local_258 = (undefined8 *)((long)(int)(uint)a2 + (long)va[0].overflow_arg_area);
      a2._0_4_ = (uint)a2 + 8;
    }
    else {
      local_258 = (undefined8 *)va[0]._0_8_;
      va[0]._0_8_ = va[0]._0_8_ + 8;
    }
    expand_vec_cmpsel(tcg_ctx,type,vece,v1,v2,v3,v4,local_78,(TCGCond)*local_258);
  }
  return;
}

Assistant:

void tcg_expand_vec_op(TCGContext *tcg_ctx, TCGOpcode opc, TCGType type, unsigned vece,
                       TCGArg a0, ...)
{
    va_list va;
    TCGArg a2;
    TCGv_vec v0, v1, v2, v3, v4;

    va_start(va, a0);
    v0 = temp_tcgv_vec(tcg_ctx, arg_temp(a0));
    v1 = temp_tcgv_vec(tcg_ctx, arg_temp(va_arg(va, TCGArg)));
    a2 = va_arg(va, TCGArg);

    switch (opc) {
    case INDEX_op_shli_vec:
    case INDEX_op_shri_vec:
        expand_vec_shi(tcg_ctx, type, vece, opc == INDEX_op_shri_vec, v0, v1, a2);
        break;

    case INDEX_op_sari_vec:
        expand_vec_sari(tcg_ctx, type, vece, v0, v1, a2);
        break;

    case INDEX_op_mul_vec:
        v2 = temp_tcgv_vec(tcg_ctx, arg_temp(a2));
        expand_vec_mul(tcg_ctx, type, vece, v0, v1, v2);
        break;

    case INDEX_op_cmp_vec:
        v2 = temp_tcgv_vec(tcg_ctx, arg_temp(a2));
        expand_vec_cmp(tcg_ctx, type, vece, v0, v1, v2, va_arg(va, TCGArg));
        break;

    case INDEX_op_cmpsel_vec:
        v2 = temp_tcgv_vec(tcg_ctx, arg_temp(a2));
        v3 = temp_tcgv_vec(tcg_ctx, arg_temp(va_arg(va, TCGArg)));
        v4 = temp_tcgv_vec(tcg_ctx, arg_temp(va_arg(va, TCGArg)));
        expand_vec_cmpsel(tcg_ctx, type, vece, v0, v1, v2, v3, v4, va_arg(va, TCGArg));
        break;

    default:
        break;
    }

    va_end(va);
}